

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *progname;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  VersionsList versions;
  fstream fs;
  
  progname = *argv;
  uVar7 = 0;
  bVar1 = false;
  while( true ) {
    do {
      bVar4 = bVar1;
      iVar2 = getopt(argc,argv,"pahvV");
      bVar1 = true;
    } while (iVar2 == 0x76);
    if (iVar2 == -1) {
      lVar8 = (long)_optind;
      versions.versions_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      versions.versions_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      versions.versions_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar5 = argc - _optind;
      versions.flags_ = uVar7;
      if (uVar5 == 0) {
        VersionsList::Read(&versions,(istream *)&std::cin);
      }
      uVar9 = 0;
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = uVar9;
      }
      for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
        std::fstream::fstream((istream *)&fs,argv[lVar8 + uVar9],_S_out|_S_in);
        VersionsList::Read(&versions,(istream *)&fs);
        std::fstream::~fstream((istream *)&fs);
      }
      VersionsList::Sort(&versions);
      if (bVar4) {
        VersionsList::VerboseDump(&versions,(ostream *)&std::cout);
      }
      else {
        VersionsList::Dump(&versions,(ostream *)&std::cout);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&versions.versions_);
      return 0;
    }
    if (iVar2 == 0x3f) break;
    if (iVar2 == 0x56) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"libversion ");
      poVar3 = std::operator<<(poVar3,"3.0.3");
      std::endl<char,std::char_traits<char>>(poVar3);
      return 0;
    }
    if (iVar2 == 0x61) {
      uVar7 = uVar7 | 2;
      bVar1 = bVar4;
    }
    else {
      if (iVar2 == 0x68) break;
      if (iVar2 != 0x70) {
        print_usage(progname);
        return 1;
      }
      uVar7 = uVar7 | 1;
      bVar1 = bVar4;
    }
  }
  print_usage(progname);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	int ch, flags = 0;
	const char* progname = argv[0];
	bool verbose = false;

	while ((ch = getopt(argc, argv, "pahvV")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'V':
			print_version();
			return 0;
		case 'v':
			verbose = true;
			break;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	VersionsList versions(flags);

	if (argc == 0) {
		versions.Read(std::cin);
	}
	for (int arg = 0; arg < argc; ++arg) {
		std::fstream fs(argv[arg]);
		versions.Read(fs);
	}

	versions.Sort();

	if (verbose) {
		versions.VerboseDump(std::cout);
	} else {
		versions.Dump(std::cout);
	}

	return 0;
}